

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O0

int If_CutLutBalancePinDelays(If_Man_t *p,If_Cut_t *pCut,char *pPerm)

{
  int iVar1;
  int iVar2;
  If_Obj_t *pIVar3;
  If_Cut_t *pIVar4;
  char *pcVar5;
  int local_40;
  int DelayMax;
  int Delay;
  int i;
  int LutSize;
  char *pCutPerm;
  char *pPerm_local;
  If_Cut_t *pCut_local;
  If_Man_t *p_local;
  
  if (*(uint *)&pCut->field_0x1c >> 0x18 == 0) {
    p_local._4_4_ = 0;
  }
  else if (*(uint *)&pCut->field_0x1c >> 0x18 == 1) {
    *pPerm = '\0';
    pIVar3 = If_CutLeaf(p,pCut,0);
    pIVar4 = If_ObjCutBest(pIVar3);
    p_local._4_4_ = (int)pIVar4->Delay;
  }
  else {
    pcVar5 = If_CutDsdPerm(p,pCut);
    iVar1 = *p->pPars->pLutStruct + -0x30;
    local_40 = -1;
    iVar2 = If_CutLeaveNum(pCut);
    if (iVar1 < iVar2 != 0 < pCut->uMaskFunc) {
      __assert_fail("(If_CutLeaveNum(pCut) > LutSize) == (pCut->uMaskFunc > 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                    ,0x155,"int If_CutLutBalancePinDelays(If_Man_t *, If_Cut_t *, char *)");
    }
    DelayMax = 0;
    while( true ) {
      iVar2 = If_CutLeaveNum(pCut);
      if (iVar2 <= DelayMax) break;
      iVar2 = If_CutLeaveNum(pCut);
      if ((iVar1 < iVar2) && ((pCut->uMaskFunc >> ((byte)(DelayMax << 1) & 0x1f) & 1U) != 0)) {
        iVar2 = Abc_Lit2Var((int)pcVar5[DelayMax]);
        pPerm[iVar2] = '\x02';
      }
      else {
        iVar2 = Abc_Lit2Var((int)pcVar5[DelayMax]);
        pPerm[iVar2] = '\x01';
      }
      DelayMax = DelayMax + 1;
    }
    DelayMax = 0;
    while( true ) {
      iVar1 = If_CutLeaveNum(pCut);
      if (iVar1 <= DelayMax) break;
      pIVar3 = If_CutLeaf(p,pCut,DelayMax);
      pIVar4 = If_ObjCutBest(pIVar3);
      local_40 = Abc_MaxInt(local_40,(int)pIVar4->Delay + (int)pPerm[DelayMax]);
      DelayMax = DelayMax + 1;
    }
    p_local._4_4_ = local_40;
  }
  return p_local._4_4_;
}

Assistant:

int If_CutLutBalancePinDelays( If_Man_t * p, If_Cut_t * pCut, char * pPerm )
{
    if ( pCut->nLeaves == 0 ) // const
        return 0;
    if ( pCut->nLeaves == 1 ) // variable
    {
        pPerm[0] = 0;
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    }
    else
    {
        char * pCutPerm = If_CutDsdPerm( p, pCut );
        int LutSize = p->pPars->pLutStruct[0] - '0';
        int i, Delay, DelayMax = -1;
        assert( (If_CutLeaveNum(pCut) > LutSize) == (pCut->uMaskFunc > 0) );
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            if ( If_CutLeaveNum(pCut) > LutSize && ((pCut->uMaskFunc >> (i << 1)) & 1) )
                pPerm[Abc_Lit2Var((int)pCutPerm[i])] = 2;
            else
                pPerm[Abc_Lit2Var((int)pCutPerm[i])] = 1;
        }
        for ( i = 0; i < If_CutLeaveNum(pCut); i++ )
        {
            Delay = (int)If_ObjCutBest(If_CutLeaf(p, pCut, i))->Delay;
            DelayMax = Abc_MaxInt( DelayMax, Delay + (int)pPerm[i] );
        }
        return DelayMax;
    }
}